

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O1

bool __thiscall
crnlib::ktx_texture::write_to_stream
          (ktx_texture *this,data_stream_serializer *serializer,bool no_keyvalue_data)

{
  ushort *puVar1;
  uint32 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  uint32 uVar9;
  uint uVar10;
  uint actual_size_7;
  uint actual_size;
  long lVar11;
  uint uVar12;
  uint actual_size_5;
  vector<unsigned_char> *pvVar13;
  ulong uVar14;
  bool bVar15;
  uint32 image_size;
  uint32 key_value_size;
  uint8 padding [3];
  uint local_70;
  uint local_6c;
  elemental_vector local_68;
  undefined2 local_54;
  undefined1 local_52;
  data_stream_serializer *local_50;
  int local_48;
  uint local_44;
  ulong local_40;
  uint local_38;
  uint local_34;
  
  local_50 = serializer;
  bVar3 = consistency_check(this);
  if (bVar3) {
    (this->m_header).m_identifier[0] = 0xab;
    (this->m_header).m_identifier[1] = 'K';
    (this->m_header).m_identifier[2] = 'T';
    (this->m_header).m_identifier[3] = 'X';
    (this->m_header).m_identifier[4] = ' ';
    (this->m_header).m_identifier[5] = '1';
    (this->m_header).m_identifier[6] = '1';
    (this->m_header).m_identifier[7] = 0xbb;
    (this->m_header).m_identifier[8] = '\r';
    (this->m_header).m_identifier[9] = '\n';
    (this->m_header).m_identifier[10] = '\x1a';
    (this->m_header).m_identifier[0xb] = '\n';
    bVar3 = this->m_opposite_endianness;
    uVar9 = 0x4030201;
    if (bVar3 != false) {
      uVar9 = 0x1020304;
    }
    (this->m_header).m_endianness = uVar9;
    if (this->m_block_dim == 1) {
      uVar4 = get_ogl_type_size((this->m_header).m_glType);
      (this->m_header).m_glTypeSize = uVar4;
      uVar9 = (this->m_header).m_glFormat;
    }
    else {
      uVar9 = get_ogl_base_internal_fmt((this->m_header).m_glInternalFormat);
    }
    (this->m_header).m_glBaseInternalFormat = uVar9;
    (this->m_header).m_bytesOfKeyValueData = 0;
    if ((!no_keyvalue_data) && (uVar14 = (ulong)(this->m_key_values).m_size, uVar14 != 0)) {
      uVar9 = (this->m_header).m_bytesOfKeyValueData;
      pvVar13 = (this->m_key_values).m_p;
      lVar11 = 0;
      do {
        uVar9 = uVar9 + (*(int *)((long)&pvVar13->m_size + lVar11) + 3U & 0xfffffffc) + 4;
        (this->m_header).m_bytesOfKeyValueData = uVar9;
        lVar11 = lVar11 + 0x10;
      } while (uVar14 << 4 != lVar11);
    }
    if (bVar3 != false) {
      lVar11 = 3;
      do {
        uVar5 = *(uint *)((this->m_header).m_identifier + lVar11 * 4);
        *(uint *)((this->m_header).m_identifier + lVar11 * 4) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 0x10);
    }
    uVar5 = (*local_50->m_pStream->_vptr_data_stream[6])(local_50->m_pStream,this,0x40);
    if (this->m_opposite_endianness == true) {
      lVar11 = 3;
      do {
        uVar6 = *(uint *)((this->m_header).m_identifier + lVar11 * 4);
        *(uint *)((this->m_header).m_identifier + lVar11 * 4) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 0x10);
    }
    if ((uVar5 & 0xffffffc0) == 0x40) {
      local_52 = 0;
      local_54 = 0;
      if ((!no_keyvalue_data) && ((this->m_key_values).m_size != 0)) {
        lVar11 = 0;
        uVar14 = 0;
        do {
          uVar5 = *(uint *)((long)&((this->m_key_values).m_p)->m_size + lVar11);
          if (this->m_opposite_endianness == true) {
            uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          }
          local_68.m_p = (void *)CONCAT44(local_68.m_p._4_4_,uVar5);
          uVar5 = (*local_50->m_pStream->_vptr_data_stream[6])(local_50->m_pStream,&local_68,4);
          if (this->m_opposite_endianness == true) {
            local_68.m_p = (void *)CONCAT44(local_68.m_p._4_4_,
                                            (uint)local_68.m_p >> 0x18 |
                                            ((uint)local_68.m_p & 0xff0000) >> 8 |
                                            ((uint)local_68.m_p & 0xff00) << 8 |
                                            (uint)local_68.m_p << 0x18);
          }
          if ((uVar5 & 0xfffffffc) != 4) {
            return false;
          }
          uVar5 = (uint)local_68.m_p;
          if ((uint)local_68.m_p != 0) {
            uVar6 = (*local_50->m_pStream->_vptr_data_stream[6])
                              (local_50->m_pStream,
                               *(undefined8 *)((long)&((this->m_key_values).m_p)->m_p + lVar11),
                               (ulong)local_68.m_p & 0xffffffff);
            if ((uVar6 != uVar5) && (uVar6 / uVar5 != 1)) {
              return false;
            }
            uVar5 = (uint)local_68.m_p - 1 & 3;
            if (uVar5 != 3) {
              uVar5 = uVar5 ^ 3;
              uVar6 = (*local_50->m_pStream->_vptr_data_stream[6])
                                (local_50->m_pStream,&local_54,(ulong)uVar5);
              if ((uVar6 != uVar5) && (uVar6 / uVar5 != 1)) {
                return false;
              }
            }
          }
          uVar14 = uVar14 + 1;
          lVar11 = lVar11 + 0x10;
        } while (uVar14 < (this->m_key_values).m_size);
      }
      uVar14 = 0;
      do {
        bVar8 = (byte)uVar14;
        uVar6 = (this->m_header).m_pixelWidth >> (bVar8 & 0x1f);
        uVar9 = (this->m_header).m_pixelHeight;
        uVar10 = uVar9 + (uVar9 == 0) >> (bVar8 & 0x1f);
        uVar9 = (this->m_header).m_pixelDepth;
        uVar12 = uVar9 + (uVar9 == 0);
        local_34 = uVar12 >> (bVar8 & 0x1f);
        local_38 = local_34 + (local_34 == 0);
        uVar5 = this->m_block_dim;
        uVar6 = (uVar5 + uVar6 + (uVar6 == 0)) - 1;
        local_70 = 1;
        if ((uVar5 <= uVar6) && (uVar10 = (uVar5 + uVar10 + (uVar10 == 0)) - 1, uVar5 <= uVar10)) {
          local_6c = (uVar6 / uVar5) * (uVar10 / uVar5) * this->m_bytes_per_block;
          uVar9 = (this->m_header).m_numberOfArrayElements;
          if ((uVar9 != 0) || ((this->m_header).m_numberOfFaces == 1)) {
            local_6c = local_6c * uVar12 * (uVar9 + (uVar9 == 0)) * (this->m_header).m_numberOfFaces
            ;
          }
          if (local_6c != 0) {
            if (this->m_opposite_endianness == true) {
              local_6c = local_6c >> 0x18 | (local_6c & 0xff0000) >> 8 | (local_6c & 0xff00) << 8 |
                         local_6c << 0x18;
            }
            uVar5 = (*local_50->m_pStream->_vptr_data_stream[6])(local_50->m_pStream,&local_6c,4);
            if (this->m_opposite_endianness == true) {
              local_6c = local_6c >> 0x18 | (local_6c & 0xff0000) >> 8 | (local_6c & 0xff00) << 8 |
                         local_6c << 0x18;
            }
            if ((uVar5 & 0xfffffffc) == 4) {
              local_40 = uVar14;
              if (((this->m_header).m_numberOfArrayElements == 0) &&
                 ((this->m_header).m_numberOfFaces == 6)) {
                uVar5 = (this->m_header).m_numberOfFaces;
                bVar3 = uVar5 != 0;
                if (bVar3) {
                  uVar6 = 0;
                  do {
                    uVar9 = (this->m_header).m_pixelDepth;
                    uVar2 = (this->m_header).m_numberOfArrayElements;
                    uVar10 = (uVar5 * (int)local_40 * (uVar2 + (uVar2 == 0)) + uVar6) *
                             (uVar9 + (uVar9 == 0));
                    pvVar13 = (this->m_image_data).m_p;
                    uVar5 = pvVar13[uVar10].m_size;
                    local_70 = 1;
                    if ((uVar5 == 0) || (uVar5 != local_6c)) goto LAB_0019d632;
                    pvVar13 = pvVar13 + uVar10;
                    if (this->m_opposite_endianness == true) {
                      local_68.m_p = (void *)0x0;
                      local_68.m_size = 0;
                      local_68.m_capacity = 0;
                      elemental_vector::increase_capacity
                                (&local_68,pvVar13->m_size,false,1,(object_mover)0x0,false);
                      local_68.m_size = pvVar13->m_size;
                      memcpy(local_68.m_p,pvVar13->m_p,(ulong)pvVar13->m_size);
                      uVar4 = local_68.m_size;
                      uVar9 = (this->m_header).m_glTypeSize;
                      if (uVar9 == 8) {
                        if (7 < local_68.m_size) {
                          lVar11 = 0;
                          do {
                            uVar14 = *(ulong *)((long)local_68.m_p + lVar11 * 8);
                            *(ulong *)((long)local_68.m_p + lVar11 * 8) =
                                 uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                 (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                                 (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                                 (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38;
                            lVar11 = lVar11 + 1;
                          } while (local_68.m_size >> 3 != (uint)lVar11);
                        }
                      }
                      else if (uVar9 == 4) {
                        if (3 < local_68.m_size) {
                          lVar11 = 0;
                          do {
                            uVar5 = *(uint *)((long)local_68.m_p + lVar11 * 4);
                            *(uint *)((long)local_68.m_p + lVar11 * 4) =
                                 uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                                 uVar5 << 0x18;
                            lVar11 = lVar11 + 1;
                          } while (local_68.m_size >> 2 != (uint)lVar11);
                        }
                      }
                      else if ((uVar9 == 2) && (1 < local_68.m_size)) {
                        lVar11 = 0;
                        do {
                          puVar1 = (ushort *)((long)local_68.m_p + lVar11 * 2);
                          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                          lVar11 = lVar11 + 1;
                        } while (local_68.m_size >> 1 != (uint)lVar11);
                      }
                      if (local_68.m_size == 0) {
                        bVar15 = false;
                      }
                      else {
                        uVar5 = (*local_50->m_pStream->_vptr_data_stream[6])
                                          (local_50->m_pStream,local_68.m_p,
                                           local_68._8_8_ & 0xffffffff);
                        bVar15 = true;
                        if (uVar5 != uVar4) {
                          bVar15 = uVar5 / uVar4 == 1;
                        }
                      }
                      if (local_68.m_p != (void *)0x0) {
                        crnlib_free(local_68.m_p);
                      }
                      if (!bVar15) goto LAB_0019d632;
                    }
                    else {
                      uVar10 = (*local_50->m_pStream->_vptr_data_stream[6])
                                         (local_50->m_pStream,pvVar13->m_p,(ulong)uVar5);
                      if ((uVar10 != uVar5) && (uVar10 / uVar5 != 1)) goto LAB_0019d632;
                    }
                    uVar5 = pvVar13->m_size - 1 & 3;
                    if (uVar5 != 3) {
                      uVar5 = uVar5 ^ 3;
                      uVar10 = (*local_50->m_pStream->_vptr_data_stream[6])
                                         (local_50->m_pStream,&local_54,(ulong)uVar5);
                      if ((uVar10 != uVar5) && (uVar10 / uVar5 != 1)) goto LAB_0019d632;
                    }
                    uVar6 = uVar6 + 1;
                    uVar5 = (this->m_header).m_numberOfFaces;
                    bVar3 = uVar6 < uVar5;
                  } while (bVar3);
                }
                local_70 = 0xb;
LAB_0019d632:
                uVar14 = local_40;
                if (!bVar3) goto LAB_0019d8a0;
              }
              else {
                local_44 = 0;
                local_48 = 0;
                do {
                  iVar7 = 0x11;
                  if ((this->m_header).m_numberOfFaces != 0) {
                    local_70 = 0;
                    do {
                      bVar3 = true;
                      uVar5 = 0;
                      do {
                        uVar9 = (this->m_header).m_pixelDepth;
                        uVar2 = (this->m_header).m_numberOfArrayElements;
                        uVar10 = (((uVar2 + (uVar2 == 0)) * (int)uVar14 + local_44) *
                                  (this->m_header).m_numberOfFaces + local_70) *
                                 (uVar9 + (uVar9 == 0)) + uVar5;
                        pvVar13 = (this->m_image_data).m_p;
                        uVar6 = pvVar13[uVar10].m_size;
                        if (uVar6 == 0) {
LAB_0019d7f9:
                          bVar15 = false;
                        }
                        else {
                          pvVar13 = pvVar13 + uVar10;
                          if (this->m_opposite_endianness == true) {
                            local_68.m_p = (void *)0x0;
                            local_68.m_size = 0;
                            local_68.m_capacity = 0;
                            elemental_vector::increase_capacity
                                      (&local_68,pvVar13->m_size,false,1,(object_mover)0x0,false);
                            local_68.m_size = pvVar13->m_size;
                            memcpy(local_68.m_p,pvVar13->m_p,(ulong)pvVar13->m_size);
                            uVar4 = local_68.m_size;
                            uVar9 = (this->m_header).m_glTypeSize;
                            if (uVar9 == 8) {
                              if (7 < local_68.m_size) {
                                lVar11 = 0;
                                do {
                                  uVar14 = *(ulong *)((long)local_68.m_p + lVar11 * 8);
                                  *(ulong *)((long)local_68.m_p + lVar11 * 8) =
                                       uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                       (uVar14 & 0xff0000000000) >> 0x18 |
                                       (uVar14 & 0xff00000000) >> 8 | (uVar14 & 0xff000000) << 8 |
                                       (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
                                       uVar14 << 0x38;
                                  lVar11 = lVar11 + 1;
                                } while (local_68.m_size >> 3 != (uint)lVar11);
                              }
                            }
                            else if (uVar9 == 4) {
                              if (3 < local_68.m_size) {
                                lVar11 = 0;
                                do {
                                  uVar6 = *(uint *)((long)local_68.m_p + lVar11 * 4);
                                  *(uint *)((long)local_68.m_p + lVar11 * 4) =
                                       uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 |
                                       (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
                                  lVar11 = lVar11 + 1;
                                } while (local_68.m_size >> 2 != (uint)lVar11);
                              }
                            }
                            else if ((uVar9 == 2) && (1 < local_68.m_size)) {
                              lVar11 = 0;
                              do {
                                puVar1 = (ushort *)((long)local_68.m_p + lVar11 * 2);
                                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                                lVar11 = lVar11 + 1;
                              } while (local_68.m_size >> 1 != (uint)lVar11);
                            }
                            if (local_68.m_size == 0) {
                              bVar15 = false;
                            }
                            else {
                              uVar6 = (*local_50->m_pStream->_vptr_data_stream[6])
                                                (local_50->m_pStream,local_68.m_p,
                                                 local_68._8_8_ & 0xffffffff);
                              bVar15 = true;
                              if (uVar6 != uVar4) {
                                bVar15 = uVar6 / uVar4 == 1;
                              }
                            }
                            if (local_68.m_p != (void *)0x0) {
                              crnlib_free(local_68.m_p);
                            }
                            uVar14 = local_40;
                            if (!bVar15) goto LAB_0019d7f9;
                          }
                          else {
                            uVar10 = (*local_50->m_pStream->_vptr_data_stream[6])
                                               (local_50->m_pStream,pvVar13->m_p,(ulong)uVar6);
                            if ((uVar10 != uVar6) && (bVar15 = false, uVar10 / uVar6 != 1))
                            goto LAB_0019d7fb;
                          }
                          local_48 = local_48 + pvVar13->m_size;
                          bVar15 = true;
                        }
LAB_0019d7fb:
                        if (!bVar15) {
                          iVar7 = 1;
                          goto LAB_0019d821;
                        }
                        uVar5 = uVar5 + 1;
                        bVar3 = uVar5 < local_34;
                      } while (uVar5 != local_38);
                      iVar7 = 0x14;
LAB_0019d821:
                      if (bVar3) goto LAB_0019d843;
                      local_70 = local_70 + 1;
                    } while (local_70 < (this->m_header).m_numberOfFaces);
                    iVar7 = 0x11;
                  }
LAB_0019d843:
                  local_70 = iVar7;
                  if (local_70 != 0x11) goto LAB_0019d861;
                  local_44 = local_44 + 1;
                } while (local_44 < (this->m_header).m_numberOfArrayElements);
                local_70 = 0xe;
LAB_0019d861:
                if (local_70 == 0xe) {
                  uVar5 = local_48 - 1U & 3;
                  if (uVar5 != 3) {
                    uVar5 = uVar5 ^ 3;
                    uVar6 = (*local_50->m_pStream->_vptr_data_stream[6])
                                      (local_50->m_pStream,&local_54,(ulong)uVar5);
                    if ((uVar6 != uVar5) && (local_70 = 1, uVar6 / uVar5 != 1)) goto LAB_0019d8a2;
                  }
LAB_0019d8a0:
                  local_70 = 0;
                }
              }
            }
          }
        }
LAB_0019d8a2:
        if (local_70 != 0) goto LAB_0019d8b7;
        uVar5 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar5;
      } while (uVar5 < (this->m_header).m_numberOfMipmapLevels);
      local_70 = 8;
LAB_0019d8b7:
      return local_70 == 8;
    }
  }
  return false;
}

Assistant:

bool ktx_texture::write_to_stream(data_stream_serializer& serializer, bool no_keyvalue_data) {
  if (!consistency_check()) {
    CRNLIB_ASSERT(0);
    return false;
  }

  memcpy(m_header.m_identifier, s_ktx_file_id, sizeof(m_header.m_identifier));
  m_header.m_endianness = m_opposite_endianness ? KTX_OPPOSITE_ENDIAN : KTX_ENDIAN;

  if (m_block_dim == 1) {
    m_header.m_glTypeSize = get_ogl_type_size(m_header.m_glType);
    m_header.m_glBaseInternalFormat = m_header.m_glFormat;
  } else {
    m_header.m_glBaseInternalFormat = get_ogl_base_internal_fmt(m_header.m_glInternalFormat);
  }

  m_header.m_bytesOfKeyValueData = 0;
  if (!no_keyvalue_data) {
    for (uint i = 0; i < m_key_values.size(); i++)
      m_header.m_bytesOfKeyValueData += sizeof(uint32) + ((m_key_values[i].size() + 3) & ~3);
  }

  if (m_opposite_endianness)
    m_header.endian_swap();

  bool success = (serializer.write(&m_header, sizeof(m_header), 1) == 1);

  if (m_opposite_endianness)
    m_header.endian_swap();

  if (!success)
    return success;

  uint total_key_value_bytes = 0;
  const uint8 padding[3] = {0, 0, 0};

  if (!no_keyvalue_data) {
    for (uint i = 0; i < m_key_values.size(); i++) {
      uint32 key_value_size = m_key_values[i].size();

      if (m_opposite_endianness)
        key_value_size = utils::swap32(key_value_size);

      success = (serializer.write(&key_value_size, sizeof(key_value_size), 1) == 1);
      total_key_value_bytes += sizeof(key_value_size);

      if (m_opposite_endianness)
        key_value_size = utils::swap32(key_value_size);

      if (!success)
        return false;

      if (key_value_size) {
        if (serializer.write(&m_key_values[i][0], key_value_size, 1) != 1)
          return false;
        total_key_value_bytes += key_value_size;

        uint num_padding = 3 - ((key_value_size + 3) % 4);
        if ((num_padding) && (serializer.write(padding, num_padding, 1) != 1))
          return false;
        total_key_value_bytes += num_padding;
      }
    }
    (void)total_key_value_bytes;
  }

  CRNLIB_ASSERT(total_key_value_bytes == m_header.m_bytesOfKeyValueData);

  for (uint mip_level = 0; mip_level < get_num_mips(); mip_level++) {
    uint mip_width, mip_height, mip_depth;
    get_mip_dim(mip_level, mip_width, mip_height, mip_depth);

    const uint mip_row_blocks = (mip_width + m_block_dim - 1) / m_block_dim;
    const uint mip_col_blocks = (mip_height + m_block_dim - 1) / m_block_dim;
    if ((!mip_row_blocks) || (!mip_col_blocks))
      return false;

    uint32 image_size = mip_row_blocks * mip_col_blocks * m_bytes_per_block;
    if ((m_header.m_numberOfArrayElements) || (get_num_faces() == 1))
      image_size *= (get_array_size() * get_num_faces() * get_depth());

    if (!image_size)
      return false;

    if (m_opposite_endianness)
      image_size = utils::swap32(image_size);

    success = (serializer.write(&image_size, sizeof(image_size), 1) == 1);

    if (m_opposite_endianness)
      image_size = utils::swap32(image_size);

    if (!success)
      return false;

    uint total_mip_size = 0;

    if ((!m_header.m_numberOfArrayElements) && (get_num_faces() == 6)) {
      // plain non-array cubemap
      for (uint face = 0; face < get_num_faces(); face++) {
        const uint8_vec& image_data = get_image_data(get_image_index(mip_level, 0, face, 0));
        if ((!image_data.size()) || (image_data.size() != image_size))
          return false;

        if (m_opposite_endianness) {
          uint8_vec tmp_image_data(image_data);
          utils::endian_swap_mem(&tmp_image_data[0], tmp_image_data.size(), m_header.m_glTypeSize);
          if (serializer.write(&tmp_image_data[0], tmp_image_data.size(), 1) != 1)
            return false;
        } else if (serializer.write(&image_data[0], image_data.size(), 1) != 1)
          return false;

        uint num_cube_pad_bytes = 3 - ((image_data.size() + 3) % 4);
        if ((num_cube_pad_bytes) && (serializer.write(padding, num_cube_pad_bytes, 1) != 1))
          return false;

        total_mip_size += image_size + num_cube_pad_bytes;
      }
    } else {
      // 1D, 2D, 3D (normal or array texture), or array cubemap
      for (uint array_element = 0; array_element < get_array_size(); array_element++) {
        for (uint face = 0; face < get_num_faces(); face++) {
          for (uint zslice = 0; zslice < mip_depth; zslice++) {
            const uint8_vec& image_data = get_image_data(get_image_index(mip_level, array_element, face, zslice));
            if (!image_data.size())
              return false;

            if (m_opposite_endianness) {
              uint8_vec tmp_image_data(image_data);
              utils::endian_swap_mem(&tmp_image_data[0], tmp_image_data.size(), m_header.m_glTypeSize);
              if (serializer.write(&tmp_image_data[0], tmp_image_data.size(), 1) != 1)
                return false;
            } else if (serializer.write(&image_data[0], image_data.size(), 1) != 1)
              return false;

            total_mip_size += image_data.size();
          }
        }
      }

      uint num_mip_pad_bytes = 3 - ((total_mip_size + 3) % 4);
      if ((num_mip_pad_bytes) && (serializer.write(padding, num_mip_pad_bytes, 1) != 1))
        return false;
      total_mip_size += num_mip_pad_bytes;
    }
    CRNLIB_ASSERT((total_mip_size & 3) == 0);
  }

  return true;
}